

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall ArgsManager::GetArgs(ArgsManager *this,string *strArg)

{
  bool bVar1;
  reference this_00;
  string *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  SettingsValue *value;
  vector<UniValue,_std::allocator<UniValue>_> *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result;
  iterator __end1;
  iterator __begin1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  UniValue *in_stack_ffffffffffffff20;
  UniValue *in_stack_ffffffffffffff28;
  undefined6 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff66;
  byte bVar2;
  undefined1 in_stack_ffffffffffffff67;
  byte bVar3;
  undefined1 local_52 [2];
  UniValue *local_50;
  UniValue *local_48;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffff18);
  GetSettingsList((ArgsManager *)
                  CONCAT17(in_stack_ffffffffffffff67,
                           CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)),in_RSI);
  local_48 = (UniValue *)
             std::vector<UniValue,_std::allocator<UniValue>_>::begin
                       ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_ffffffffffffff20);
  local_50 = (UniValue *)
             std::vector<UniValue,_std::allocator<UniValue>_>::end
                       ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_ffffffffffffff20);
  while (bVar1 = __gnu_cxx::
                 operator==<UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                           ((__normal_iterator<UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                             *)in_stack_ffffffffffffff28,
                            (__normal_iterator<UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                             *)in_stack_ffffffffffffff20), ((bVar1 ^ 0xffU) & 1) != 0) {
    this_00 = __gnu_cxx::
              __normal_iterator<UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>::
              operator*((__normal_iterator<UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                         *)in_stack_ffffffffffffff18);
    bVar3 = 0;
    bVar2 = 0;
    bVar1 = UniValue::isFalse(in_stack_ffffffffffffff28);
    if (bVar1) {
      std::allocator<char>::allocator();
      bVar3 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 (char *)CONCAT17(1,CONCAT16(bVar2,in_stack_ffffffffffffff60)),
                 (allocator<char> *)in_RSI);
    }
    else {
      bVar1 = UniValue::isTrue(in_stack_ffffffffffffff28);
      if (bVar1) {
        in_stack_ffffffffffffff28 = (UniValue *)local_52;
        std::allocator<char>::allocator();
        bVar2 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   (char *)CONCAT17(bVar3,CONCAT16(1,in_stack_ffffffffffffff60)),
                   (allocator<char> *)in_RSI);
      }
      else {
        in_stack_ffffffffffffff20 =
             (UniValue *)UniValue::get_str_abi_cxx11_(in_stack_ffffffffffffff20);
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(bVar3,CONCAT16(bVar2,in_stack_ffffffffffffff60)),in_RSI);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffff28,(value_type *)in_stack_ffffffffffffff20);
    std::__cxx11::string::~string(in_stack_ffffffffffffff18);
    if ((bVar2 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)local_52);
    }
    if ((bVar3 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)(local_52 + 1));
    }
    __gnu_cxx::__normal_iterator<UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>::
    operator++((__normal_iterator<UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_> *)
               in_stack_ffffffffffffff18);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_ffffffffffffff28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<std::string> ArgsManager::GetArgs(const std::string& strArg) const
{
    std::vector<std::string> result;
    for (const common::SettingsValue& value : GetSettingsList(strArg)) {
        result.push_back(value.isFalse() ? "0" : value.isTrue() ? "1" : value.get_str());
    }
    return result;
}